

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_utilities.hpp
# Opt level: O0

size_t jsoncons::jsonpath::escape_string<wchar_t,std::__cxx11::wstring>
                 (wchar_t *s,size_t length,
                 basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *sink)

{
  int iVar1;
  wchar_t in_EDX;
  long in_RSI;
  int *in_RDI;
  wchar_t c;
  wchar_t *it;
  wchar_t *end;
  wchar_t *begin;
  size_t count;
  int *local_38;
  size_t local_20;
  
  local_20 = 0;
  for (local_38 = in_RDI; local_38 != in_RDI + in_RSI; local_38 = local_38 + 1) {
    iVar1 = *local_38;
    if (iVar1 == 8) {
      std::__cxx11::wstring::push_back(in_EDX);
      std::__cxx11::wstring::push_back(in_EDX);
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 9) {
      std::__cxx11::wstring::push_back(in_EDX);
      std::__cxx11::wstring::push_back(in_EDX);
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 10) {
      std::__cxx11::wstring::push_back(in_EDX);
      std::__cxx11::wstring::push_back(in_EDX);
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 0xc) {
      std::__cxx11::wstring::push_back(in_EDX);
      std::__cxx11::wstring::push_back(in_EDX);
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 0xd) {
      std::__cxx11::wstring::push_back(in_EDX);
      std::__cxx11::wstring::push_back(in_EDX);
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 0x27) {
      std::__cxx11::wstring::push_back(in_EDX);
      std::__cxx11::wstring::push_back(in_EDX);
      local_20 = local_20 + 2;
    }
    else if (iVar1 == 0x5c) {
      std::__cxx11::wstring::push_back(in_EDX);
      std::__cxx11::wstring::push_back(in_EDX);
      local_20 = local_20 + 2;
    }
    else {
      std::__cxx11::wstring::push_back(in_EDX);
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

std::size_t escape_string(const CharT* s, std::size_t length, Sink& sink)
    {
        std::size_t count = 0;
        const CharT* begin = s;
        const CharT* end = s + length;
        for (const CharT* it = begin; it != end; ++it)
        {
            CharT c = *it;
            switch (c)
            {
                case '\\':
                    sink.push_back('\\');
                    sink.push_back('\\');
                    count += 2;
                    break;
                case '\'':
                    sink.push_back('\\');
                    sink.push_back('\'');
                    count += 2;
                    break;
                case '\b':
                    sink.push_back('\\');
                    sink.push_back('b');
                    count += 2;
                    break;
                case '\f':
                    sink.push_back('\\');
                    sink.push_back('f');
                    count += 2;
                    break;
                case '\n':
                    sink.push_back('\\');
                    sink.push_back('n');
                    count += 2;
                    break;
                case '\r':
                    sink.push_back('\\');
                    sink.push_back('r');
                    count += 2;
                    break;
                case '\t':
                    sink.push_back('\\');
                    sink.push_back('t');
                    count += 2;
                    break;
                default:
                    sink.push_back(c);
                    ++count;
                    break;
            }
        }
        return count;
    }